

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

int Cec_SetActivityFactors(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  int LevelMax;
  
  if (-1 < (p->pSat->act_vars).size) {
    (p->pSat->act_vars).size = 0;
    Gia_ManIncrementTravId(p->pAig);
    LevelMax = Gia_ObjLevel(p->pAig,pObj);
    Cec_SetActivityFactors_rec(p,pObj,(int)((double)LevelMax * 0.5),LevelMax);
    return 1;
  }
  __assert_fail("k <= v->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                ,0x30,"void veci_resize(veci *, int)");
}

Assistant:

int Cec_SetActivityFactors( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{
    float dActConeRatio = 0.5;
    int LevelMin, LevelMax;
    // reset the active variables
    veci_resize(&p->pSat->act_vars, 0);
    // prepare for traversal
    Gia_ManIncrementTravId( p->pAig );
    // determine the min and max level to visit
    assert( dActConeRatio > 0 && dActConeRatio < 1 );
    LevelMax = Gia_ObjLevel(p->pAig,pObj);
    LevelMin = (int)(LevelMax * (1.0 - dActConeRatio));
    // traverse
    Cec_SetActivityFactors_rec( p, pObj, LevelMin, LevelMax );
//Cec_PrintActivity( p );
    return 1;
}